

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O0

void __thiscall Refal2::CArbitraryInteger::Mul(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  bool bVar1;
  bool bVar2;
  bool resultSign;
  CArbitraryInteger *operand_local;
  CArbitraryInteger *this_local;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = IsNegative(this);
  bVar2 = IsNegative(operand);
  mul(this,operand);
  SetSign(this,bVar1 != bVar2);
  removeLeadingZeros(this);
  return;
}

Assistant:

void CArbitraryInteger::Mul( const CArbitraryInteger& operand )
{
	removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	const bool resultSign = IsNegative() != operand.IsNegative();
	mul( operand );
	SetSign( resultSign );
	removeLeadingZeros();
}